

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O2

pair<double,_double> __thiscall
manager::Manager<ttt::Board>::Match
          (Manager<ttt::Board> *this,longlong bot_id1,longlong bot_id2,int count)

{
  Board *pBVar1;
  double dVar2;
  undefined1 auVar3 [12];
  ulong uVar4;
  IBot<ttt::Board> *pIVar5;
  uint uVar6;
  int iVar7;
  iterator iVar8;
  iterator iVar9;
  Board *this_00;
  IBot<ttt::Board> *pIVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined8 uVar15;
  undefined1 auVar14 [16];
  pair<double,_double> pVar16;
  undefined1 local_98 [32];
  IBot<ttt::Board> *bs [2];
  IMove move;
  Manager<ttt::Board> *local_48;
  longlong bot_id2_local;
  longlong bot_id1_local;
  
  local_48 = this;
  bot_id2_local = bot_id2;
  bot_id1_local = bot_id1;
  iVar8 = std::
          _Hashtable<long_long,_std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_std::allocator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->bots)._M_h,&bot_id1_local);
  iVar9 = std::
          _Hashtable<long_long,_std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_std::allocator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->bots)._M_h,&bot_id2_local);
  uVar12 = 0;
  uVar6 = 0;
  if (0 < count) {
    uVar6 = count;
  }
  local_98._0_16_ = ZEXT816(0);
  do {
    if (uVar12 == uVar6) {
      dVar2 = (double)count;
      auVar13._8_4_ = SUB84(dVar2,0);
      auVar13._0_8_ = dVar2;
      auVar13._12_4_ = (int)((ulong)dVar2 >> 0x20);
      auVar13 = divpd(local_98._0_16_,auVar13);
      uVar15 = 0;
      pVar16 = MM::operator()((MM *)bs,*(double *)
                                        (*(long *)((long)iVar8.
                                                  super__Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false>
                                                  ._M_cur + 0x10) + 0x10),
                              *(double *)
                               (*(long *)((long)iVar9.
                                                super__Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false>
                                                ._M_cur + 0x10) + 0x10),auVar13._0_8_);
      *(double *)
       (*(long *)((long)iVar8.
                        super__Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false>
                        ._M_cur + 0x10) + 0x10) = pVar16.first;
      *(double *)
       (*(long *)((long)iVar9.
                        super__Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false>
                        ._M_cur + 0x10) + 0x10) = pVar16.second;
      auVar3._4_8_ = uVar15;
      auVar3._0_4_ = auVar13._4_4_;
      auVar14._0_8_ = auVar3._0_8_ << 0x20;
      auVar14._8_4_ = auVar13._8_4_;
      auVar14._12_4_ = auVar13._12_4_;
      pVar16.second = auVar14._8_8_;
      pVar16.first = auVar13._0_8_;
      return pVar16;
    }
    this_00 = (Board *)operator_new(10);
    pBVar1 = local_48->game;
    *(undefined8 *)(this_00->board)._M_elems = *(undefined8 *)(pBVar1->board)._M_elems;
    *(undefined2 *)((this_00->board)._M_elems[2]._M_elems + 2) =
         *(undefined2 *)((pBVar1->board)._M_elems[2]._M_elems + 2);
    bs[0] = (IBot<ttt::Board> *)0x0;
    bs[1] = (IBot<ttt::Board> *)0x0;
    pIVar10 = (IBot<ttt::Board> *)
              (**(code **)(**(long **)(*(long *)((long)iVar8.
                                                  super__Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false>
                                                  ._M_cur + 0x10) + 8) + 0x10))();
    uVar11 = uVar12 & 1;
    bs[uVar11] = pIVar10;
    pIVar10 = (IBot<ttt::Board> *)
              (**(code **)(**(long **)(*(long *)((long)iVar9.
                                                  super__Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false>
                                                  ._M_cur + 0x10) + 8) + 0x10))();
    bs[uVar11 ^ 1] = pIVar10;
    iVar7 = ttt::Board::GetStatus(this_00);
    pIVar5 = bs[1];
    pIVar10 = bs[0];
    while (iVar7 == -1) {
      iVar7 = (*pIVar10->_vptr_IBot[3])(pIVar10);
      move = CONCAT44(extraout_var,iVar7);
      ttt::Board::ApplyMove(this_00,&move);
      (*pIVar5->_vptr_IBot[4])(pIVar5,&move);
      iVar7 = ttt::Board::GetStatus(this_00);
      if (iVar7 != -1) break;
      iVar7 = (*pIVar5->_vptr_IBot[3])(pIVar5);
      move = CONCAT44(extraout_var_00,iVar7);
      ttt::Board::ApplyMove(this_00,&move);
      (*pIVar10->_vptr_IBot[4])(pIVar10,&move);
      iVar7 = ttt::Board::GetStatus(this_00);
    }
    if (iVar7 == 1) {
      if (uVar11 != 0) goto LAB_00161f05;
LAB_00161eec:
      dVar2 = (double)local_98._0_8_ + 1.0;
LAB_00161ef9:
      uVar4 = (ulong)local_98._8_8_ >> 0x20;
      local_98._8_4_ = (int)local_98._8_8_;
      local_98._0_8_ = dVar2;
      local_98._12_4_ = (int)uVar4;
    }
    else {
      if (iVar7 == 0) {
        dVar2 = (double)local_98._0_8_ + 0.5;
        local_98._8_8_ = (double)local_98._8_8_ + 0.5;
        goto LAB_00161ef9;
      }
      if (uVar11 != 0) goto LAB_00161eec;
LAB_00161f05:
      local_98._8_8_ = (double)local_98._8_8_ + 1.0;
    }
    if (pIVar10 != (IBot<ttt::Board> *)0x0) {
      (*pIVar10->_vptr_IBot[1])(pIVar10);
    }
    if (pIVar5 != (IBot<ttt::Board> *)0x0) {
      (*pIVar5->_vptr_IBot[1])(pIVar5);
    }
    operator_delete(this_00);
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

std::pair<double, double>
Manager<IGame>::Match(long long bot_id1, long long bot_id2, int count)
{
    auto it1 = bots.find(bot_id1), it2 = bots.find(bot_id2);

    std::pair<double, double> results;

    for (int i = 0; i < count; ++i)
    {
        auto game_copy = new IGame(*game);
        game::IBot<IGame> *bs[2] = {};
        bs[i % 2] = it1->second->bot->Clone();
        bs[1 - i % 2] = it2->second->bot->Clone();
        int status = game_copy->GetStatus();
        while (status == game::Undecided)
        {
            auto move = bs[0]->MakeMove();
            game_copy->ApplyMove(move);
            bs[1]->SendMove(move);

            status = game_copy->GetStatus();
            if (status != game::Undecided)
                break;

            move = bs[1]->MakeMove();
            game_copy->ApplyMove(move);
            bs[0]->SendMove(move);

            status = game_copy->GetStatus();
        }

        if (status == game::Draw)
            results.first += 0.5, results.second += 0.5;
        else if (status == 1)
            i % 2 == 0 ? results.first += 1.0 : results.second += 1.0;
        else
            i % 2 == 0 ? results.second += 1.0 : results.first += 1.0;

        delete bs[0];
        delete bs[1];
        delete game_copy;
    }

    results.first /= count, results.second /= count;

    auto new_ratings = MM()(it1->second->rating, it2->second->rating, results.first);
    it1->second->rating = new_ratings.first, it2->second->rating = new_ratings.second;

    return results;
}